

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_reference_finite_element.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::ScalarReferenceFiniteElement<double>::NodalValuesToDofs
          (ScalarReferenceFiniteElement<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodvals)

{
  uint uVar1;
  ulong uVar2;
  ostream *poVar3;
  DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *in_RDX;
  Index extraout_RDX;
  Matrix<double,_1,__1,_1,_1,__1> MVar4;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *local_20;
  Matrix<double,_1,__1,_1,_1,__1> *nodvals_local;
  ScalarReferenceFiniteElement<double> *this_local;
  
  local_20 = in_RDX;
  nodvals_local = nodvals;
  this_local = this;
  uVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)in_RDX);
  uVar1 = (*(code *)(nodvals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                    m_storage.m_data[10])();
  if (uVar2 != uVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"nodvals = ");
    poVar3 = Eigen::operator<<(poVar3,local_20);
    poVar3 = std::operator<<(poVar3," <-> ");
    uVar1 = (*(code *)(nodvals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_data[10])();
    std::ostream::operator<<(poVar3,uVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"nodvals.cols() == NumEvaluationNodes()",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/scalar_reference_finite_element.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x13a,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/scalar_reference_finite_element.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
    lf::base::AssertionFailed(&local_248,&local_270,0x13a,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,(Matrix<double,_1,__1,_1,_1,__1> *)local_20);
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       extraout_RDX;
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] virtual Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>
  NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>& nodvals) const {
    LF_ASSERT_MSG(nodvals.cols() == NumEvaluationNodes(),
                  "nodvals = " << nodvals << " <-> " << NumEvaluationNodes());
    return nodvals;
  }